

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O0

CURLcode Curl_output_digest(connectdata *conn,_Bool proxy,uchar *request,uchar *uripath)

{
  SessionHandle *data_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CURLcode CVar5;
  int iVar6;
  size_t sVar7;
  uchar *puVar8;
  char *pcVar9;
  void *pvVar10;
  char *pcVar11;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 uVar12;
  uchar *md5this2;
  digestdata *pdStack_170;
  CURLcode rc;
  digestdata *d;
  SessionHandle *data;
  auth *authp;
  char *passwdp;
  char *userp_quoted;
  char *userp;
  size_t userlen;
  char **allocuserpwd;
  char *tmp;
  size_t cnonce_sz;
  char *cnonce;
  char cnoncebuf [33];
  uchar local_e8 [8];
  uchar ha2 [33];
  uchar local_b8 [8];
  uchar ha1 [33];
  uchar *md5this;
  uchar request_digest [33];
  uchar local_58 [8];
  uchar md5buf [16];
  size_t urilen;
  uchar *uripath_local;
  uchar *request_local;
  _Bool proxy_local;
  connectdata *conn_local;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  cnonce_sz = 0;
  tmp = (char *)0x0;
  data_00 = conn->data;
  if (proxy) {
    pdStack_170 = &(data_00->state).proxydigest;
    userlen = (size_t)&conn->allocptr;
    userp_quoted = conn->proxyuser;
    authp = (auth *)conn->proxypasswd;
    data = (SessionHandle *)&(data_00->state).authproxy;
  }
  else {
    pdStack_170 = &(data_00->state).digest;
    userlen = (size_t)&(conn->allocptr).userpwd;
    userp_quoted = conn->user;
    authp = (auth *)conn->passwd;
    data = (SessionHandle *)&(data_00->state).authhost;
  }
  if (*(long *)userlen != 0) {
    (*Curl_cfree)(*(void **)userlen);
    *(undefined8 *)userlen = 0;
  }
  if (userp_quoted == (char *)0x0) {
    userp_quoted = "";
  }
  if (authp == (auth *)0x0) {
    authp = (auth *)0x9a61b7;
  }
  if (pdStack_170->nonce == (char *)0x0) {
    *(undefined1 *)&data->mstate = CURLM_STATE_INIT;
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    *(undefined1 *)&data->mstate = CURLM_STATE_CONNECT_PEND;
    if (pdStack_170->nc == 0) {
      pdStack_170->nc = 1;
    }
    if (pdStack_170->cnonce == (char *)0x0) {
      uVar1 = Curl_rand(data_00);
      uVar2 = Curl_rand(data_00);
      uVar3 = Curl_rand(data_00);
      uVar4 = Curl_rand(data_00);
      curl_msnprintf((char *)&cnonce,0x21,"%08x%08x%08x%08x",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                     CONCAT44(uVar12,uVar4));
      sVar7 = strlen((char *)&cnonce);
      CVar5 = Curl_base64_encode(data_00,(char *)&cnonce,sVar7,(char **)&cnonce_sz,(size_t *)&tmp);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      pdStack_170->cnonce = (char *)cnonce_sz;
    }
    register0x00000000 = (uchar *)curl_maprintf("%s:%s:%s",userp_quoted,pdStack_170->realm,authp);
    if (register0x00000000 == (uchar *)0x0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      Curl_md5it(local_58,register0x00000000);
      if (stack0xffffffffffffff70 != (uchar *)0x0) {
        (*Curl_cfree)(stack0xffffffffffffff70);
        stack0xffffffffffffff70 = (uchar *)0x0;
      }
      md5_to_ascii(local_58,local_b8);
      if (pdStack_170->algo == 1) {
        puVar8 = (uchar *)curl_maprintf("%s:%s:%s",local_b8,pdStack_170->nonce,pdStack_170->cnonce);
        if (puVar8 == (uchar *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        Curl_md5it(local_58,puVar8);
        if (puVar8 != (uchar *)0x0) {
          (*Curl_cfree)(puVar8);
        }
        md5_to_ascii(local_58,local_b8);
      }
      if (((data->mstate & 0x10000) == CURLM_STATE_INIT) ||
         (pcVar9 = strchr((char *)uripath,0x3f), pcVar9 == (char *)0x0)) {
        md5buf._8_8_ = strlen((char *)uripath);
      }
      else {
        md5buf._8_8_ = (long)pcVar9 - (long)uripath;
      }
      register0x00000000 = (uchar *)curl_maprintf("%s:%.*s",request,md5buf._8_8_,uripath);
      puVar8 = register0x00000000;
      if (((pdStack_170->qop != (char *)0x0) &&
          (iVar6 = Curl_raw_equal(pdStack_170->qop,"auth-int"), puVar8 = stack0xffffffffffffff70,
          iVar6 != 0)) &&
         (puVar8 = (uchar *)curl_maprintf("%s:%s",stack0xffffffffffffff70,
                                          "d41d8cd98f00b204e9800998ecf8427e"),
         stack0xffffffffffffff70 != (uchar *)0x0)) {
        (*Curl_cfree)(stack0xffffffffffffff70);
      }
      stack0xffffffffffffff70 = puVar8;
      if (stack0xffffffffffffff70 == (uchar *)0x0) {
        conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        Curl_md5it(local_58,stack0xffffffffffffff70);
        if (stack0xffffffffffffff70 != (uchar *)0x0) {
          (*Curl_cfree)(stack0xffffffffffffff70);
          stack0xffffffffffffff70 = (uchar *)0x0;
        }
        md5_to_ascii(local_58,local_e8);
        if (pdStack_170->qop == (char *)0x0) {
          register0x00000000 =
               (uchar *)curl_maprintf("%s:%s:%s",local_b8,pdStack_170->nonce,local_e8);
        }
        else {
          register0x00000000 =
               (uchar *)curl_maprintf("%s:%s:%08x:%s:%s:%s",local_b8,pdStack_170->nonce,
                                      (ulong)(uint)pdStack_170->nc,pdStack_170->cnonce,
                                      pdStack_170->qop,local_e8);
        }
        if (stack0xffffffffffffff70 == (uchar *)0x0) {
          conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          Curl_md5it(local_58,stack0xffffffffffffff70);
          if (stack0xffffffffffffff70 != (uchar *)0x0) {
            (*Curl_cfree)(stack0xffffffffffffff70);
            stack0xffffffffffffff70 = (uchar *)0x0;
          }
          md5_to_ascii(local_58,(uchar *)&md5this);
          pcVar9 = string_quoted(userp_quoted);
          if (pcVar9 == (char *)0x0) {
            conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            if (pdStack_170->qop == (char *)0x0) {
              pcVar11 = "";
              if (proxy) {
                pcVar11 = "Proxy-";
              }
              pcVar11 = curl_maprintf("%sAuthorization: Digest username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%.*s\", response=\"%s\""
                                      ,pcVar11,pcVar9,pdStack_170->realm,pdStack_170->nonce,
                                      md5buf._8_8_,uripath,&md5this);
              *(char **)userlen = pcVar11;
            }
            else {
              pcVar11 = "";
              if (proxy) {
                pcVar11 = "Proxy-";
              }
              pcVar11 = curl_maprintf("%sAuthorization: Digest username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%.*s\", cnonce=\"%s\", nc=%08x, qop=%s, response=\"%s\""
                                      ,pcVar11,pcVar9,pdStack_170->realm,pdStack_170->nonce,
                                      md5buf._8_8_,uripath,pdStack_170->cnonce,pdStack_170->nc,
                                      pdStack_170->qop,&md5this);
              *(char **)userlen = pcVar11;
              iVar6 = Curl_raw_equal(pdStack_170->qop,"auth");
              if (iVar6 != 0) {
                pdStack_170->nc = pdStack_170->nc + 1;
              }
            }
            if (pcVar9 != (char *)0x0) {
              (*Curl_cfree)(pcVar9);
            }
            if (*(long *)userlen == 0) {
              conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              if (pdStack_170->opaque != (char *)0x0) {
                pcVar9 = curl_maprintf("%s, opaque=\"%s\"",*(undefined8 *)userlen,
                                       pdStack_170->opaque);
                if (pcVar9 == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                (*Curl_cfree)(*(void **)userlen);
                *(char **)userlen = pcVar9;
              }
              if (pdStack_170->algorithm != (char *)0x0) {
                pcVar9 = curl_maprintf("%s, algorithm=\"%s\"",*(undefined8 *)userlen,
                                       pdStack_170->algorithm);
                if (pcVar9 == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                (*Curl_cfree)(*(void **)userlen);
                *(char **)userlen = pcVar9;
              }
              sVar7 = strlen(*(char **)userlen);
              pvVar10 = (*Curl_crealloc)(*(void **)userlen,sVar7 + 3);
              if (pvVar10 == (void *)0x0) {
                conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                strcpy((char *)((long)pvVar10 + sVar7),"\r\n");
                *(void **)userlen = pvVar10;
                conn_local._4_4_ = CURLE_OK;
              }
            }
          }
        }
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_output_digest(struct connectdata *conn,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  /* We have a Digest setup for this, use it!  Now, to get all the details for
     this sorted out, I must urge you dear friend to read up on the RFC2617
     section 3.2.2, */
  size_t urilen;
  unsigned char md5buf[16]; /* 16 bytes/128 bits */
  unsigned char request_digest[33];
  unsigned char *md5this;
  unsigned char ha1[33];/* 32 digits and 1 zero byte */
  unsigned char ha2[33];/* 32 digits and 1 zero byte */
  char cnoncebuf[33];
  char *cnonce = NULL;
  size_t cnonce_sz = 0;
  char *tmp = NULL;
  char **allocuserpwd;
  size_t userlen;
  const char *userp;
  char *userp_quoted;
  const char *passwdp;
  struct auth *authp;

  struct SessionHandle *data = conn->data;
  struct digestdata *d;
  CURLcode rc;
/* The CURL_OUTPUT_DIGEST_CONV macro below is for non-ASCII machines.
   It converts digest text to ASCII so the MD5 will be correct for
   what ultimately goes over the network.
*/
#define CURL_OUTPUT_DIGEST_CONV(a, b) \
  rc = Curl_convert_to_network(a, (char *)b, strlen((const char*)b)); \
  if(rc != CURLE_OK) { \
    free(b); \
    return rc; \
  }

  if(proxy) {
    d = &data->state.proxydigest;
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->proxyuser;
    passwdp = conn->proxypasswd;
    authp = &data->state.authproxy;
  }
  else {
    d = &data->state.digest;
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp="";

  if(!passwdp)
    passwdp="";

  if(!d->nonce) {
    authp->done = FALSE;
    return CURLE_OK;
  }
  authp->done = TRUE;

  if(!d->nc)
    d->nc = 1;

  if(!d->cnonce) {
    snprintf(cnoncebuf, sizeof(cnoncebuf), "%08x%08x%08x%08x",
             Curl_rand(data), Curl_rand(data),
             Curl_rand(data), Curl_rand(data));
    rc = Curl_base64_encode(data, cnoncebuf, strlen(cnoncebuf),
                            &cnonce, &cnonce_sz);
    if(rc)
      return rc;
    d->cnonce = cnonce;
  }

  /*
    if the algorithm is "MD5" or unspecified (which then defaults to MD5):

    A1 = unq(username-value) ":" unq(realm-value) ":" passwd

    if the algorithm is "MD5-sess" then:

    A1 = H( unq(username-value) ":" unq(realm-value) ":" passwd )
         ":" unq(nonce-value) ":" unq(cnonce-value)
  */

  md5this = (unsigned char *)
    aprintf("%s:%s:%s", userp, d->realm, passwdp);
  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  Curl_safefree(md5this);
  md5_to_ascii(md5buf, ha1);

  if(d->algo == CURLDIGESTALGO_MD5SESS) {
    /* nonce and cnonce are OUTSIDE the hash */
    tmp = aprintf("%s:%s:%s", ha1, d->nonce, d->cnonce);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;
    CURL_OUTPUT_DIGEST_CONV(data, tmp); /* convert on non-ASCII machines */
    Curl_md5it(md5buf, (unsigned char *)tmp);
    Curl_safefree(tmp);
    md5_to_ascii(md5buf, ha1);
  }

  /*
    If the "qop" directive's value is "auth" or is unspecified, then A2 is:

      A2       = Method ":" digest-uri-value

          If the "qop" value is "auth-int", then A2 is:

      A2       = Method ":" digest-uri-value ":" H(entity-body)

    (The "Method" value is the HTTP request method as specified in section
    5.1.1 of RFC 2616)
  */

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     http://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle && ((tmp = strchr((char *)uripath, '?')) != NULL))
    urilen = tmp - (char *)uripath;
  else
    urilen = strlen((char *)uripath);

  md5this = (unsigned char *)aprintf("%s:%.*s", request, urilen, uripath);

  if(d->qop && Curl_raw_equal(d->qop, "auth-int")) {
    /* We don't support auth-int for PUT or POST at the moment.
       TODO: replace md5 of empty string with entity-body for PUT/POST */
    unsigned char *md5this2 = (unsigned char *)
      aprintf("%s:%s", md5this, "d41d8cd98f00b204e9800998ecf8427e");
    Curl_safefree(md5this);
    md5this = md5this2;
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  Curl_safefree(md5this);
  md5_to_ascii(md5buf, ha2);

  if(d->qop) {
    md5this = (unsigned char *)aprintf("%s:%s:%08x:%s:%s:%s",
                                       ha1,
                                       d->nonce,
                                       d->nc,
                                       d->cnonce,
                                       d->qop,
                                       ha2);
  }
  else {
    md5this = (unsigned char *)aprintf("%s:%s:%s",
                                       ha1,
                                       d->nonce,
                                       ha2);
  }
  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  Curl_safefree(md5this);
  md5_to_ascii(md5buf, request_digest);

  /* for test case 64 (snooped from a Mozilla 1.3a request)

    Authorization: Digest username="testuser", realm="testrealm", \
    nonce="1053604145", uri="/64", response="c55f7f30d83d774a3d2dcacf725abaca"

    Digest parameters are all quoted strings.  Username which is provided by
    the user will need double quotes and backslashes within it escaped.  For
    the other fields, this shouldn't be an issue.  realm, nonce, and opaque
    are copied as is from the server, escapes and all.  cnonce is generated
    with web-safe characters.  uri is already percent encoded.  nc is 8 hex
    characters.  algorithm and qop with standard values only contain web-safe
    chracters.
  */
  userp_quoted = string_quoted(userp);
  if(!userp_quoted)
    return CURLE_OUT_OF_MEMORY;

  if(d->qop) {
    *allocuserpwd =
      aprintf( "%sAuthorization: Digest "
               "username=\"%s\", "
               "realm=\"%s\", "
               "nonce=\"%s\", "
               "uri=\"%.*s\", "
               "cnonce=\"%s\", "
               "nc=%08x, "
               "qop=%s, "
               "response=\"%s\"",
               proxy?"Proxy-":"",
               userp_quoted,
               d->realm,
               d->nonce,
               urilen, uripath, /* this is the PATH part of the URL */
               d->cnonce,
               d->nc,
               d->qop,
               request_digest);

    if(Curl_raw_equal(d->qop, "auth"))
      d->nc++; /* The nc (from RFC) has to be a 8 hex digit number 0 padded
                  which tells to the server how many times you are using the
                  same nonce in the qop=auth mode. */
  }
  else {
    *allocuserpwd =
      aprintf( "%sAuthorization: Digest "
               "username=\"%s\", "
               "realm=\"%s\", "
               "nonce=\"%s\", "
               "uri=\"%.*s\", "
               "response=\"%s\"",
               proxy?"Proxy-":"",
               userp_quoted,
               d->realm,
               d->nonce,
               urilen, uripath, /* this is the PATH part of the URL */
               request_digest);
  }
  Curl_safefree(userp_quoted);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  /* Add optional fields */
  if(d->opaque) {
    /* append opaque */
    tmp = aprintf("%s, opaque=\"%s\"", *allocuserpwd, d->opaque);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;
    free(*allocuserpwd);
    *allocuserpwd = tmp;
  }

  if(d->algorithm) {
    /* append algorithm */
    tmp = aprintf("%s, algorithm=\"%s\"", *allocuserpwd, d->algorithm);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;
    free(*allocuserpwd);
    *allocuserpwd = tmp;
  }

  /* append CRLF + zero (3 bytes) to the userpwd header */
  userlen = strlen(*allocuserpwd);
  tmp = realloc(*allocuserpwd, userlen + 3);
  if(!tmp)
    return CURLE_OUT_OF_MEMORY;
  strcpy(&tmp[userlen], "\r\n"); /* append the data */
  *allocuserpwd = tmp;

  return CURLE_OK;
}